

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O1

int __thiscall
absl::synchronization_internal::GraphCycles::GetStackTrace(GraphCycles *this,GraphId id,void ***ptr)

{
  Node *pNVar1;
  
  pNVar1 = (this->rep_->nodes_).ptr_[id.handle & 0xffffffff];
  if ((pNVar1 != (Node *)0x0) && (pNVar1->version == (uint32_t)(id.handle >> 0x20))) {
    *ptr = pNVar1->stack;
    return pNVar1->nstack;
  }
  *ptr = (void **)0x0;
  return 0;
}

Assistant:

int GraphCycles::GetStackTrace(GraphId id, void*** ptr) {
  Node* n = FindNode(rep_, id);
  if (n == nullptr) {
    *ptr = nullptr;
    return 0;
  } else {
    *ptr = n->stack;
    return n->nstack;
  }
}